

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void ly_ctx_unset_searchdirs(ly_ctx *ctx)

{
  char **__ptr;
  long lVar1;
  
  __ptr = (ctx->models).search_paths;
  if (__ptr != (char **)0x0) {
    lVar1 = 0;
    while (*(void **)((long)__ptr + lVar1) != (void *)0x0) {
      free(*(void **)((long)__ptr + lVar1));
      lVar1 = lVar1 + 8;
      __ptr = (ctx->models).search_paths;
    }
    free(__ptr);
    (ctx->models).search_paths = (char **)0x0;
  }
  return;
}

Assistant:

API void
ly_ctx_unset_searchdirs(struct ly_ctx *ctx)
{
    int i;

    if (!ctx->models.search_paths) {
        return;
    }

    for (i = 0; ctx->models.search_paths[i]; i++) {
        free(ctx->models.search_paths[i]);
    }
    free(ctx->models.search_paths);
    ctx->models.search_paths = NULL;
}